

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

appender fmt::v9::detail::write_escaped_char<char,fmt::v9::appender>(appender out,char v)

{
  bool bVar1;
  uint32_t cp;
  undefined7 in_register_00000031;
  char local_29;
  find_escape_result<char> local_28;
  
  local_28.begin = (char *)CONCAT71(local_28.begin._1_7_,0x27);
  local_29 = v;
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
             (char *)&local_28);
  cp = (uint32_t)CONCAT71(in_register_00000031,v);
  bVar1 = needs_escape(cp);
  if (((v == '\"' | ~bVar1) & v != '\'') == 0) {
    local_28.begin = &local_29;
    local_28.end = (char *)&local_28;
    local_28.cp = cp;
    out = write_escaped_cp<fmt::v9::appender,char>(out,&local_28);
  }
  else {
    buffer<char>::push_back
              ((buffer<char> *)
               out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,&local_29);
  }
  local_28.begin = (char *)CONCAT71(local_28.begin._1_7_,0x27);
  buffer<char>::push_back
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
             (char *)&local_28);
  return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(
        out, find_escape_result<Char>{&v, &v + 1, static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}